

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::
constraintsSecondPartialDerivativeWRTControlSparsity
          (OptimalControlProblem *this,SparsityStructure *controlSparsity)

{
  OptimalControlProblemPimpl *pOVar1;
  bool bVar2;
  _Base_ptr p_Var3;
  size_t numberOfRows;
  size_t numberOfColumns;
  _Self __tmp;
  ostringstream errorMsg;
  char *local_1c8 [4];
  ostringstream local_1a8 [376];
  
  p_Var3 = (this->m_pimpl->constraintsGroups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar2 = true;
  do {
    pOVar1 = this->m_pimpl;
    if (bVar2 == false) {
      if ((pOVar1->dynamicalSystem).
          super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == (element_type *)0x0) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::operator<<((ostream *)local_1a8,
                        "Not all groups have the hessian sparsity defined and no dynamical system has been provided yet. Cannot determine the sparsity since the control dimension is unknown."
                       );
        std::__cxx11::stringbuf::str();
        iDynTree::reportError
                  ("OptimalControlProblem","constraintsSecondPartialDerivativeWRTControlSparsity",
                   local_1c8[0]);
        std::__cxx11::string::~string((string *)local_1c8);
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        bVar2 = false;
      }
      else {
        SparsityStructure::clear(&pOVar1->constraintsControlHessianSparsity);
        pOVar1 = this->m_pimpl;
        numberOfRows = DynamicalSystem::controlSpaceSize
                                 ((pOVar1->dynamicalSystem).
                                  super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
        numberOfColumns =
             DynamicalSystem::controlSpaceSize
                       ((this->m_pimpl->dynamicalSystem).
                        super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
        SparsityStructure::addDenseBlock
                  (&pOVar1->constraintsControlHessianSparsity,0,0,numberOfRows,numberOfColumns);
LAB_00182a07:
        SparsityStructure::operator=
                  (controlSparsity,&this->m_pimpl->constraintsControlHessianSparsity);
        bVar2 = true;
      }
      return bVar2;
    }
    if ((_Rb_tree_header *)p_Var3 == &(pOVar1->constraintsGroups)._M_t._M_impl.super__Rb_tree_header
       ) {
      SparsityStructure::clear(&pOVar1->constraintsControlHessianSparsity);
      pOVar1 = this->m_pimpl;
      for (p_Var3 = (pOVar1->constraintsGroups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
          ; (_Rb_tree_header *)p_Var3 !=
            &(pOVar1->constraintsGroups)._M_t._M_impl.super__Rb_tree_header;
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
        SparsityStructure::merge
                  (&this->m_pimpl->constraintsControlHessianSparsity,
                   (SparsityStructure *)(*(long *)(p_Var3 + 2) + 600));
      }
      goto LAB_00182a07;
    }
    bVar2 = ConstraintsGroup::constraintsSecondPartialDerivativeWRTControlSparsity
                      ((ConstraintsGroup *)**(undefined8 **)(p_Var3 + 2),
                       (SparsityStructure *)(*(undefined8 **)(p_Var3 + 2) + 0x4b));
    *(bool *)(*(long *)(p_Var3 + 2) + 0x329) = bVar2;
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
  } while( true );
}

Assistant:

bool OptimalControlProblem::constraintsSecondPartialDerivativeWRTControlSparsity(SparsityStructure &controlSparsity)
        {
            bool allHaveSparsity = true;

            auto group = m_pimpl->constraintsGroups.begin();

            while (allHaveSparsity && group != m_pimpl->constraintsGroups.end()) {
                group->second->hasControlHessianSparsity =
                    group->second->group_ptr->constraintsSecondPartialDerivativeWRTControlSparsity(group->second->controlHessianSparsity);
                allHaveSparsity &= group->second->hasControlHessianSparsity;
                group++;
            }

            if (allHaveSparsity) {
                m_pimpl->constraintsControlHessianSparsity.clear();

                for (auto& groupPtr : m_pimpl->constraintsGroups) {
                    m_pimpl->constraintsControlHessianSparsity.merge(groupPtr.second->controlHessianSparsity);
                }

            } else {
                if (m_pimpl->dynamicalSystem) {
                    m_pimpl->constraintsControlHessianSparsity.clear();
                    m_pimpl->constraintsControlHessianSparsity.addDenseBlock(0, 0, m_pimpl->dynamicalSystem->controlSpaceSize(), m_pimpl->dynamicalSystem->controlSpaceSize());
                } else {
                    std::ostringstream errorMsg;
                    errorMsg << "Not all groups have the hessian sparsity defined and no dynamical system has been provided yet. Cannot determine the sparsity since the control dimension is unknown.";
                    reportError("OptimalControlProblem", "constraintsSecondPartialDerivativeWRTControlSparsity", errorMsg.str().c_str());
                    return false;
                }
            }

            controlSparsity = m_pimpl->constraintsControlHessianSparsity;
            return true;
        }